

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DeleteProgram::DeleteProgram
          (DeleteProgram *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40 [2];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program_local;
  DeleteProgram *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = program;
  program_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)this;
  Operation::Operation(&this->super_Operation,"DeleteProgram",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DeleteProgram_032778d8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&this->m_program,program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Program>
            (local_40,&this->m_program);
  Operation::modifyGLObject(&this->super_Operation,local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_40);
  return;
}

Assistant:

DeleteProgram::DeleteProgram (SharedPtr<Program> program, bool useSync, bool serverSync)
	: Operation	("DeleteProgram", useSync, serverSync)
	, m_program	(program)
{
	modifyGLObject(SharedPtr<Object>(m_program));
}